

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Instr * __thiscall GlobOpt::OptPeep(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  Opnd *pOVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  ByteCodeUsesInstr *this_00;
  Sym *sym;
  
  if (this->prePassLoop != (Loop *)0x0) {
    return instr;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < DeadBrOnHasProperty) {
    if (2 < OVar1 - 0x1a0) {
      if (OVar1 != Ld_A) {
        return instr;
      }
LAB_00450dad:
      pOVar8 = instr->m_dst;
      pOVar2 = instr->m_src1;
      OVar6 = IR::Opnd::GetKind(pOVar8);
      if (OVar6 != OpndKindReg) {
        return instr;
      }
      bVar5 = IR::Opnd::IsEqual(pOVar8,pOVar2);
      if (!bVar5) {
        return instr;
      }
      pOVar8 = IR::Instr::UnlinkDst(instr);
      if ((pOVar8->field_0xb & 8) == 0) {
        this_00 = IR::ByteCodeUsesInstr::New(instr);
        IR::Instr::SetDst(&this_00->super_Instr,pOVar8);
        IR::Instr::InsertAfter(instr,&this_00->super_Instr);
      }
      IR::Instr::FreeSrc1(instr);
      goto LAB_00450ecf;
    }
    pOVar8 = instr->m_src1;
    pOVar2 = instr->m_src2;
    if ((src1Val == (Value *)0x0) ||
       (bVar5 = ValueType::IsPrimitive(&src1Val->valueInfo->super_ValueType), !bVar5)) {
      OVar6 = IR::Opnd::GetKind(pOVar8);
      if (OVar6 != OpndKindReg) {
        return instr;
      }
      pBVar3 = this->currentBlock;
      OVar6 = IR::Opnd::GetKind(pOVar8);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_00450eda;
        *puVar7 = 0;
      }
      bVar5 = GlobOptBlockData::IsTypeSpecialized(&pBVar3->globOptData,(Sym *)pOVar8[1]._vptr_Opnd);
      if (!bVar5) {
        return instr;
      }
    }
    if ((src2Val == (Value *)0x0) ||
       (bVar5 = ValueType::IsPrimitive(&src2Val->valueInfo->super_ValueType), !bVar5)) {
      OVar6 = IR::Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindReg) {
        return instr;
      }
      pBVar3 = this->currentBlock;
      OVar6 = IR::Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_00450eda:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
      sym = (Sym *)pOVar2[1]._vptr_Opnd;
LAB_00450eb7:
      bVar5 = GlobOptBlockData::IsTypeSpecialized(&pBVar3->globOptData,sym);
      if (!bVar5) {
        return instr;
      }
    }
  }
  else {
    if (OVar1 != DeadBrOnHasProperty) {
      if (OVar1 != Ld_I4) {
        return instr;
      }
      goto LAB_00450dad;
    }
    pOVar8 = instr->m_src1;
    if ((src1Val == (Value *)0x0) ||
       (bVar5 = ValueType::IsPrimitive(&src1Val->valueInfo->super_ValueType), !bVar5)) {
      OVar6 = IR::Opnd::GetKind(pOVar8);
      if (OVar6 != OpndKindReg) {
        return instr;
      }
      pBVar3 = this->currentBlock;
      OVar6 = IR::Opnd::GetKind(pOVar8);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_00450eda;
        *puVar7 = 0;
      }
      sym = (Sym *)pOVar8[1]._vptr_Opnd;
      goto LAB_00450eb7;
    }
  }
  CaptureByteCodeSymUses(this,instr);
LAB_00450ecf:
  instr->m_opcode = Nop;
  return instr;
}

Assistant:

IR::Instr *
GlobOpt::OptPeep(IR::Instr *instr, Value *src1Val, Value *src2Val)
{
    IR::Opnd *dst, *src1, *src2;

    if (this->IsLoopPrePass())
    {
        return instr;
    }

    switch (instr->m_opcode)
    {
        case Js::OpCode::DeadBrEqual:
        case Js::OpCode::DeadBrRelational:
        case Js::OpCode::DeadBrSrEqual:
            src1 = instr->GetSrc1();
            src2 = instr->GetSrc2();

            // These branches were turned into dead branches because they were unnecessary (branch to next, ...).
            // The DeadBr are necessary in case the evaluation of the sources have side-effects.
            // If we know for sure the srcs are primitive or have been type specialized, we don't need these instructions
            if (((src1Val && src1Val->GetValueInfo()->IsPrimitive()) || (src1->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src1->AsRegOpnd()->m_sym))) &&
                ((src2Val && src2Val->GetValueInfo()->IsPrimitive()) || (src2->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src2->AsRegOpnd()->m_sym))))
            {
                this->CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
        case Js::OpCode::DeadBrOnHasProperty:
            src1 = instr->GetSrc1();

            if (((src1Val && src1Val->GetValueInfo()->IsPrimitive()) || (src1->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src1->AsRegOpnd()->m_sym))))
            {
                this->CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
        case Js::OpCode::Ld_A:
        case Js::OpCode::Ld_I4:
            src1 = instr->GetSrc1();
            dst = instr->GetDst();

            if (dst->IsRegOpnd() && dst->IsEqual(src1))
            {
                dst = instr->UnlinkDst();
                if (!dst->GetIsJITOptimizedReg())
                {
                    IR::ByteCodeUsesInstr *bytecodeUse = IR::ByteCodeUsesInstr::New(instr);
                    bytecodeUse->SetDst(dst);
                    instr->InsertAfter(bytecodeUse);
                }
                instr->FreeSrc1();
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
    }
    return instr;
}